

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall CMU462::HalfedgeMesh::splitPolygon(HalfedgeMesh *this,FaceIter f)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  Size SVar4;
  pointer pFVar5;
  pointer pHVar6;
  VertexIter *pVVar7;
  HalfedgeIter *pHVar8;
  HalfedgeMesh *this_00;
  reference p_Var9;
  FaceIter FVar10;
  EdgeIter EVar11;
  HalfedgeIter HVar12;
  HalfedgeIter HVar13;
  EdgeIter *pEVar14;
  pointer this_01;
  pointer pVVar15;
  FaceIter *pFVar16;
  HalfedgeIter *pHVar17;
  _List_node_base *in_RSI;
  HalfedgeIter main_Halfedge;
  HalfedgeIter new_Halfedge2;
  HalfedgeIter new_Halfedge1;
  EdgeIter new_Edge;
  FaceIter new_Face;
  VertexIter curr_vertex;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  *__range1;
  HalfedgeIter temp;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  vertexes;
  HalfedgeIter last_Halfedge;
  VertexIter main_vertex;
  HalfedgeIter in_stack_fffffffffffffe38;
  __normal_iterator<std::_List_iterator<CMU462::Vertex>_*,_std::vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>_>
  *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  Face *in_stack_fffffffffffffe50;
  HalfedgeMesh *in_stack_fffffffffffffea8;
  HalfedgeMesh *in_stack_fffffffffffffed8;
  __normal_iterator<std::_List_iterator<CMU462::Vertex>_*,_std::vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>_>
  local_68;
  undefined1 *local_60;
  _Self local_48;
  undefined1 local_40 [24];
  _List_node_base *local_28;
  _List_node_base *local_20;
  _List_node_base *local_18;
  _List_node_base *local_8;
  
  local_8 = in_RSI;
  std::_List_iterator<CMU462::Face>::operator->
            ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
  SVar4 = Face::degree(in_stack_fffffffffffffe50);
  if (3 < SVar4) {
    pFVar5 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
    Face::halfedge(pFVar5);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
    pVVar7 = Halfedge::vertex(pHVar6);
    local_18 = pVVar7->_M_node;
    pFVar5 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
    pHVar8 = Face::halfedge(pFVar5);
    local_28 = pHVar8->_M_node;
    local_20 = (_List_node_base *)prev_Halfedge(in_stack_fffffffffffffe38);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              *)0x247d61);
    pFVar5 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
    Face::halfedge(pFVar5);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
    Halfedge::next(pHVar6);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
    pHVar8 = Halfedge::next(pHVar6);
    local_48._M_node = pHVar8->_M_node;
    do {
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      Halfedge::vertex(pHVar6);
      std::
      vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                   *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      this_00 = (HalfedgeMesh *)Halfedge::next(pHVar6);
      local_48._M_node =
           (this_00->halfedges).
           super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
           super__List_node_base._M_next;
      pFVar5 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
      pHVar8 = Face::halfedge(pFVar5);
      bVar3 = std::operator!=(&local_48,pHVar8);
    } while (bVar3);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::pop_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                *)0x247e82);
    local_60 = local_40;
    local_68._M_current =
         (_List_iterator<CMU462::Vertex> *)
         std::
         vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
         ::begin((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                  *)in_stack_fffffffffffffe38._M_node);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::end((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
           *)in_stack_fffffffffffffe38._M_node);
    while (bVar3 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffe40,
                              (__normal_iterator<std::_List_iterator<CMU462::Vertex>_*,_std::vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>_>
                               *)in_stack_fffffffffffffe38._M_node), bVar3) {
      p_Var9 = __gnu_cxx::
               __normal_iterator<std::_List_iterator<CMU462::Vertex>_*,_std::vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>_>
               ::operator*(&local_68);
      p_Var1 = p_Var9->_M_node;
      FVar10 = newFace(this_00);
      EVar11 = newEdge(in_stack_fffffffffffffed8);
      HVar12 = newHalfedge(in_stack_fffffffffffffea8);
      HVar13 = newHalfedge(in_stack_fffffffffffffea8);
      pFVar5 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
      pHVar8 = Face::halfedge(pFVar5);
      p_Var2 = pHVar8->_M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pEVar14 = Halfedge::edge(pHVar6);
      pEVar14->_M_node = EVar11._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pEVar14 = Halfedge::edge(pHVar6);
      pEVar14->_M_node = EVar11._M_node;
      this_01 = std::_List_iterator<CMU462::Edge>::operator->
                          ((_List_iterator<CMU462::Edge> *)0x248031);
      pHVar8 = Edge::halfedge(this_01);
      pHVar8->_M_node = HVar12._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffed8 = (HalfedgeMesh *)Halfedge::twin(pHVar6);
      (in_stack_fffffffffffffed8->halfedges).
      super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
      super__List_node_base._M_next = HVar13._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pHVar8 = Halfedge::twin(pHVar6);
      pHVar8->_M_node = HVar12._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pVVar7 = Halfedge::vertex(pHVar6);
      pVVar7->_M_node = p_Var1;
      pVVar15 = std::_List_iterator<CMU462::Vertex>::operator->
                          ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffe40);
      pHVar8 = Vertex::halfedge(pVVar15);
      pHVar8->_M_node = HVar12._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pVVar7 = Halfedge::vertex(pHVar6);
      pVVar7->_M_node = local_18;
      pVVar15 = std::_List_iterator<CMU462::Vertex>::operator->
                          ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffe40);
      pHVar8 = Vertex::halfedge(pVVar15);
      pHVar8->_M_node = HVar13._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffea8 = (HalfedgeMesh *)Halfedge::face(pHVar6);
      (in_stack_fffffffffffffea8->halfedges).
      super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
      super__List_node_base._M_next = FVar10._M_node;
      pFVar5 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
      pHVar8 = Face::halfedge(pFVar5);
      pHVar8->_M_node = HVar12._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pFVar16 = Halfedge::face(pHVar6);
      pFVar16->_M_node = local_8;
      pFVar5 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffe40);
      pHVar8 = Face::halfedge(pFVar5);
      pHVar8->_M_node = HVar13._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pHVar8 = Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pHVar17 = Halfedge::next(pHVar6);
      pHVar17->_M_node = pHVar8->_M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pHVar8 = Halfedge::next(pHVar6);
      pHVar8->_M_node = HVar12._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pHVar8 = Halfedge::next(pHVar6);
      pHVar8->_M_node = p_Var2;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      pHVar8 = Halfedge::next(pHVar6);
      pHVar8->_M_node = HVar13._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe50 = (Face *)Halfedge::face(pHVar6);
      (in_stack_fffffffffffffe50->super_HalfedgeElement)._vptr_HalfedgeElement =
           (_func_int **)FVar10._M_node;
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe40 =
           (__normal_iterator<std::_List_iterator<CMU462::Vertex>_*,_std::vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>_>
            *)Halfedge::face(pHVar6);
      in_stack_fffffffffffffe40->_M_current = (_List_iterator<CMU462::Vertex> *)FVar10._M_node;
      __gnu_cxx::
      __normal_iterator<std::_List_iterator<CMU462::Vertex>_*,_std::vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>_>
      ::operator++(&local_68);
    }
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::~vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
               *)in_stack_fffffffffffffe50);
  }
  return;
}

Assistant:

void HalfedgeMesh::splitPolygon(FaceIter f) {
	// TODO: (meshedit) 
	// Triangulate a polygonal face
	if (f->degree() < 4) return;

	VertexIter main_vertex = f->halfedge()->vertex();
	HalfedgeIter last_Halfedge = prev_Halfedge(f->halfedge());
	vector<VertexIter> vertexes;

	HalfedgeIter temp = f->halfedge()->next()->next();
	do {
		vertexes.push_back(temp->vertex());
		temp = temp->next();
	} while (temp != f->halfedge());
	vertexes.pop_back();


	for (VertexIter curr_vertex : vertexes) {
		FaceIter new_Face = newFace();
		EdgeIter new_Edge = newEdge();
		HalfedgeIter new_Halfedge1 = newHalfedge();
		HalfedgeIter new_Halfedge2 = newHalfedge();

		HalfedgeIter main_Halfedge = f->halfedge();

		new_Halfedge1->edge() = new_Edge;
		new_Halfedge2->edge() = new_Edge;
		new_Edge->halfedge() = new_Halfedge1;

		new_Halfedge1->twin() = new_Halfedge2;
		new_Halfedge2->twin() = new_Halfedge1;

		new_Halfedge1->vertex() = curr_vertex;
		curr_vertex->halfedge() = new_Halfedge1;
		new_Halfedge2->vertex() = main_vertex;
		main_vertex->halfedge() = new_Halfedge2;

		new_Halfedge1->face() = new_Face;
		new_Face->halfedge() = new_Halfedge1;
		new_Halfedge2->face() = f;
		f->halfedge() = new_Halfedge2;

		new_Halfedge2->next() = main_Halfedge->next()->next();
		main_Halfedge->next()->next() = new_Halfedge1;
		new_Halfedge1->next() = main_Halfedge;
		last_Halfedge->next() = new_Halfedge2;

		main_Halfedge->face() = new_Face;
		main_Halfedge->next()->face() = new_Face;
	}

	//showError("splitPolygon() not implemented.");
}